

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.c
# Opt level: O1

void status_change_color_on(wchar_t *col,attr_t *attr,long old1,long old2,long new1,long new2)

{
  attr_t aVar1;
  wchar_t nh_color;
  
  nh_color = L'\x02';
  if (((new1 <= old1) && (nh_color = L'\x01', old1 <= new1)) && (nh_color = L'\x02', new2 <= old2))
  {
    nh_color = (wchar_t)(new2 < old2);
  }
  *col = nh_color;
  if (nh_color != L'\0') {
    aVar1 = curses_color_attr(nh_color,0);
    *attr = aVar1;
    wattr_on(statuswin,aVar1,0);
    return;
  }
  return;
}

Assistant:

static void status_change_color_on(int *col, attr_t *attr,
				   long old1, long old2, long new1, long new2)
{
    *col = status_change_color(old1, old2, new1, new2);
    if (*col) {
	*attr = curses_color_attr(*col, 0);
	wattron(statuswin, *attr);
    }
}